

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeLeq
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *currentFrontier,LocalDomChg *domchg,HighsInt *inds,double *vals,HighsInt len,double rhs,
          double minAct)

{
  _Rb_tree_header *p_Var1;
  pointer *ppRVar2;
  double dVar3;
  pointer pRVar4;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  HighsDomain *pHVar6;
  pointer ppVar7;
  pointer pdVar8;
  iterator __position;
  pointer pRVar9;
  HighsMipSolver *pHVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  int iVar15;
  _Base_ptr p_Var16;
  NodeSetArray *pNVar17;
  long lVar18;
  pointer ppVar19;
  _Base_ptr p_Var20;
  int *piVar21;
  ulong uVar22;
  double dVar23;
  _Base_ptr p_Var24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined8 uVar28;
  HighsCDouble M;
  double local_a0;
  double local_98;
  ResolveCandidate local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  ulong local_50;
  HighsInt *local_48;
  NodeSetArray *local_40;
  vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
  *local_38;
  
  if (-INFINITY < minAct) {
    uVar13 = (ulong)(uint)len;
    local_38 = (vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
                *)&this->resolveBuffer;
    local_58 = rhs;
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::reserve((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               *)local_38,(long)len);
    pRVar4 = (this->resolveBuffer).
             super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->resolveBuffer).
        super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
        ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
      (this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
    }
    if (0 < len) {
      _Var5._M_head_impl =
           (this->localdom->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      p_Var1 = &(currentFrontier->_M_t)._M_impl.super__Rb_tree_header;
      local_40 = (NodeSetArray *)((long)&(_Var5._M_head_impl)->nodequeue + 0x48);
      uVar22 = 0;
      dVar26 = 0.0;
      uVar28 = 0;
      local_a0 = 0.0;
      local_98 = minAct;
      local_50 = uVar13;
      local_48 = inds;
LAB_002975bb:
      lVar12 = (long)inds[uVar22];
      if (inds[uVar22] != (domchg->domchg).column) {
        local_88.valuePos = (HighsInt)uVar22;
        dVar3 = vals[uVar22];
        pHVar6 = this->localdom;
        ppVar7 = (pHVar6->prevboundval_).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (dVar3 <= 0.0) {
          ppVar19 = (pointer)((pHVar6->col_upper_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
          piVar21 = (pHVar6->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar12;
          do {
            dVar23 = ppVar19->first;
            local_88.boundPos = *piVar21;
            if (local_88.boundPos <= domchg->pos) {
              if (local_88.boundPos == -1) goto LAB_002975cb;
              if ((ppVar7[local_88.boundPos].first != dVar23) ||
                 (NAN(ppVar7[local_88.boundPos].first) || NAN(dVar23))) goto LAB_00297703;
            }
            ppVar19 = ppVar7 + local_88.boundPos;
            piVar21 = &ppVar7[local_88.boundPos].second;
          } while( true );
        }
        ppVar19 = (pointer)((pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar12);
        piVar21 = (pHVar6->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12;
        do {
          dVar23 = ppVar19->first;
          local_88.boundPos = *piVar21;
          if (local_88.boundPos <= domchg->pos) {
            if (local_88.boundPos == -1) goto LAB_002975cb;
            if ((ppVar7[local_88.boundPos].first != dVar23) ||
               (NAN(ppVar7[local_88.boundPos].first) || NAN(dVar23))) goto LAB_002976a0;
          }
          ppVar19 = ppVar7 + local_88.boundPos;
          piVar21 = &ppVar7[local_88.boundPos].second;
        } while( true );
      }
      dVar26 = vals[uVar22];
      uVar28 = 0;
      goto LAB_002975cb;
    }
  }
  return false;
LAB_00297703:
  pdVar8 = (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  p_Var24 = (_Base_ptr)pdVar8[lVar12];
  if ((double)p_Var24 <= dVar23) goto LAB_002975cb;
  pdVar14 = pdVar8 + lVar12;
  p_Var20 = (currentFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var16 = &p_Var1->_M_header;
  if (p_Var20 != (_Base_ptr)0x0) {
    do {
      if (local_88.boundPos <= (int)p_Var20[1]._M_color) {
        p_Var16 = p_Var20;
      }
      p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < local_88.boundPos];
    } while (p_Var20 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var16 != p_Var1) && ((int)p_Var16[1]._M_color <= local_88.boundPos)) {
      p_Var24 = p_Var16[1]._M_parent;
      dVar27 = *pdVar14;
      if (((double)p_Var24 != dVar27) || (NAN((double)p_Var24) || NAN(dVar27))) {
        dVar25 = ((double)p_Var24 - dVar27) * dVar3;
        dVar27 = local_98 + dVar25;
        local_a0 = local_a0 +
                   (local_98 - (dVar27 - dVar25)) + (dVar25 - (dVar27 - (dVar27 - dVar25)));
        local_98 = dVar27;
      }
      local_88.baseBound = (double)p_Var24;
      if ((double)p_Var24 <= dVar23) goto LAB_002975cb;
    }
  }
  local_88.delta = dVar23 - (double)p_Var24;
  pNVar17 = local_40;
  local_88.baseBound = (double)p_Var24;
  goto LAB_00297766;
LAB_002976a0:
  pdVar8 = (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  p_Var24 = (_Base_ptr)pdVar8[lVar12];
  if (dVar23 <= (double)p_Var24) goto LAB_002975cb;
  pdVar14 = pdVar8 + lVar12;
  p_Var20 = (currentFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var16 = &p_Var1->_M_header;
  if (p_Var20 != (_Base_ptr)0x0) {
    do {
      if (local_88.boundPos <= (int)p_Var20[1]._M_color) {
        p_Var16 = p_Var20;
      }
      p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < local_88.boundPos];
    } while (p_Var20 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var16 != p_Var1) && ((int)p_Var16[1]._M_color <= local_88.boundPos)) {
      p_Var24 = p_Var16[1]._M_parent;
      dVar27 = *pdVar14;
      if (((double)p_Var24 != dVar27) || (NAN((double)p_Var24) || NAN(dVar27))) {
        dVar25 = ((double)p_Var24 - dVar27) * dVar3;
        dVar27 = local_98 + dVar25;
        local_a0 = local_a0 +
                   (local_98 - (dVar27 - dVar25)) + (dVar25 - (dVar27 - (dVar27 - dVar25)));
        local_98 = dVar27;
      }
      local_88.baseBound = (double)p_Var24;
      if (dVar23 <= (double)p_Var24) goto LAB_002975cb;
    }
  }
  local_88.delta = dVar23 - (double)p_Var24;
  pNVar17 = (NodeSetArray *)((long)&(_Var5._M_head_impl)->nodequeue + 0x40);
  local_88.baseBound = (double)p_Var24;
LAB_00297766:
  local_88.delta = local_88.delta * dVar3;
  local_88.prio =
       ABS((double)(*(long *)((long)pNVar17->_M_t + 0x30 + lVar12 * 0x38) + 1) *
           (dVar23 - *pdVar14) * dVar3);
  __position._M_current =
       (this->resolveBuffer).
       super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68 = dVar26;
    uStack_60 = uVar28;
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
    ::_M_realloc_insert<HighsDomain::ConflictSet::ResolveCandidate_const&>
              (local_38,__position,&local_88);
    uVar13 = local_50;
    inds = local_48;
    dVar26 = local_68;
    uVar28 = uStack_60;
  }
  else {
    (__position._M_current)->prio = local_88.prio;
    (__position._M_current)->boundPos = local_88.boundPos;
    (__position._M_current)->valuePos = local_88.valuePos;
    (__position._M_current)->delta = local_88.delta;
    *(undefined4 *)&(__position._M_current)->baseBound = local_88.baseBound._0_4_;
    *(undefined4 *)((long)&(__position._M_current)->baseBound + 4) = local_88.baseBound._4_4_;
    ppRVar2 = &(this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar2 = *ppRVar2 + 1;
  }
LAB_002975cb:
  uVar22 = uVar22 + 1;
  if (uVar22 == uVar13) {
    if ((dVar26 == 0.0) && (!NAN(dVar26))) {
      return false;
    }
    pRVar4 = (this->resolveBuffer).
             super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar9 = (this->resolveBuffer).
             super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar4 != pRVar9) {
      uVar13 = (long)pRVar9 - (long)pRVar4 >> 5;
      iVar15 = 0;
      if (1 < uVar13) {
        iVar15 = 0;
        do {
          uVar13 = (long)uVar13 >> 1;
          iVar15 = iVar15 + 1;
        } while (1 < uVar13);
      }
      local_68 = dVar26;
      uStack_60 = uVar28;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>,false>
                (pRVar4,pRVar9,iVar15,1);
      dVar26 = local_68;
    }
    dVar3 = (domchg->domchg).boundval;
    pHVar10 = this->localdom->mipsolver;
    lVar12 = (long)(domchg->domchg).column;
    _Var5._M_head_impl =
         (pHVar10->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    if ((pHVar10->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] == kContinuous) {
      dVar23 = (_Var5._M_head_impl)->epsilon;
    }
    else {
      dVar23 = (_Var5._M_head_impl)->feastol * -10.0 + 1.0;
    }
    if ((domchg->domchg).boundtype == kLower) {
      dVar3 = dVar3 - dVar23;
    }
    else {
      dVar3 = dVar3 + dVar23;
    }
    lVar18 = 0x308;
    if (dVar26 < 0.0) {
      lVar18 = 800;
    }
    dVar27 = dVar26 * *(double *)
                       (*(long *)((long)&(this->globaldom->changedcolsflags_).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar18) +
                       lVar12 * 8);
    dVar23 = local_98 - dVar27;
    M.lo = local_a0 + (local_98 - (dVar27 + dVar23)) + (-dVar27 - (dVar23 - (dVar27 + dVar23)));
    M.hi = dVar23;
    bVar11 = resolveLinearLeq(this,M,local_58 - dVar3 * dVar26,vals);
    return bVar11;
  }
  goto LAB_002975bb;
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeLeq(
    const std::set<LocalDomChg>& currentFrontier, const LocalDomChg& domchg,
    const HighsInt* inds, const double* vals, HighsInt len, double rhs,
    double minAct) {
  if (minAct == -kHighsInf) return false;
  // get the coefficient value of the column for which we want to explain
  // the bound change
  double domchgVal = 0;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  HighsCDouble M = minAct;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    if (col == domchg.domchg.column) {
      domchgVal = vals[i];
      continue;
    }

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double lb = localdom.getColLowerPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_lower_[col] >= lb || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});

      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_lower_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_lower_[col]);
        if (cand.baseBound >= lb) continue;
      } else
        cand.baseBound = globaldom.col_lower_[col];

      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    } else {
      double ub = localdom.getColUpperPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_upper_[col] <= ub || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});
      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_upper_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_upper_[col]);
        if (cand.baseBound <= ub) continue;
      } else
        cand.baseBound = globaldom.col_upper_[col];

      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    }

    resolveBuffer.push_back(cand);
  }

  if (domchgVal == 0) return false;

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  assert(domchgVal != 0);

  // to explain the bound change we start from the bound constraint,
  // multiply it by the columns coefficient in the constraint. Then the
  // bound constraint is a0 * x0 <= b0 and the constraint
  // a0 * x0 + \sum ai * xi <= b. Let the min activity of \sum ai xi be M,
  // then the constraint yields the bound a0 * x0 <= b - M. If M is
  // sufficiently large the bound constraint is implied. Therefore we
  // increase M by updating it with the stronger local bounds until
  // M >= b - b0 holds.
  double b0 = domchg.domchg.boundval;
  if (localdom.mipsolver->variableType(domchg.domchg.column) !=
      HighsVarType::kContinuous) {
    // in case of an integral variable the bound was rounded and can be
    // relaxed by 1-feastol. We use 1 - 10 * feastol for numerical safety
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
    else
      b0 += (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
  } else {
    // for a continuous variable we relax the bound by epsilon to
    // accommodate for tiny rounding errors
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= localdom.mipsolver->mipdata_->epsilon;
    else
      b0 += localdom.mipsolver->mipdata_->epsilon;
  }

  // now multiply the bound constraint with the coefficient value in the
  // constraint to obtain b0
  b0 *= domchgVal;

  // compute the lower bound of M that is necessary
  double Mlower = rhs - b0;

  // M is the global residual activity initially
  if (domchgVal < 0)
    M -= domchgVal * globaldom.col_upper_[domchg.domchg.column];
  else
    M -= domchgVal * globaldom.col_lower_[domchg.domchg.column];

  return resolveLinearLeq(M, Mlower, vals);
}